

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O2

int run_test_we_get_signal_one_shot(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  timer_ctx tc;
  signal_ctx sc;
  
  loop = uv_default_loop();
  start_timer(loop,0x11,&tc);
  start_watcher(loop,0x11,&sc,1);
  sc.stop_or_close = NOOP;
  iVar1 = uv_run(loop,UV_RUN_DEFAULT);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    eval_a = (int64_t)tc.ncalls;
    eval_b = 10;
    if (eval_a == 10) {
      eval_a = 1;
      eval_b = (int64_t)sc.ncalls;
      if (eval_b == 1) {
        start_timer(loop,0x11,&tc);
        iVar1 = uv_run(loop,UV_RUN_DEFAULT);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          eval_a = 1;
          eval_b = (int64_t)sc.ncalls;
          if (eval_b == 1) {
            sc.stop_or_close = CLOSE;
            sc.ncalls = 0;
            uv_signal_start_oneshot(&sc.handle,signal_cb_one_shot,0x11);
            start_timer(loop,0x11,&tc);
            iVar1 = uv_run(loop,UV_RUN_DEFAULT);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              eval_a = (int64_t)tc.ncalls;
              eval_b = 10;
              if (eval_a == 10) {
                eval_a = 1;
                eval_b = (int64_t)sc.ncalls;
                if (eval_b == 1) {
                  close_loop(loop);
                  eval_a = 0;
                  iVar1 = uv_loop_close(loop);
                  eval_b = (int64_t)iVar1;
                  if (eval_b == 0) {
                    uv_library_shutdown();
                    return 0;
                  }
                  pcVar4 = "uv_loop_close(loop)";
                  pcVar3 = "0";
                  uVar2 = 0xf1;
                }
                else {
                  pcVar4 = "sc.ncalls";
                  pcVar3 = "1";
                  uVar2 = 0xef;
                }
              }
              else {
                pcVar4 = "10";
                pcVar3 = "tc.ncalls";
                uVar2 = 0xee;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "uv_run(loop, UV_RUN_DEFAULT)";
              uVar2 = 0xed;
            }
          }
          else {
            pcVar4 = "sc.ncalls";
            pcVar3 = "1";
            uVar2 = 0xe7;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "uv_run(loop, UV_RUN_DEFAULT)";
          uVar2 = 0xe6;
        }
      }
      else {
        pcVar4 = "sc.ncalls";
        pcVar3 = "1";
        uVar2 = 0xe3;
      }
    }
    else {
      pcVar4 = "10";
      pcVar3 = "tc.ncalls";
      uVar2 = 0xe2;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_run(loop, UV_RUN_DEFAULT)";
    uVar2 = 0xe1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(we_get_signal_one_shot) {
  struct signal_ctx sc;
  struct timer_ctx tc;
  uv_loop_t* loop;

  loop = uv_default_loop();
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, &sc, 1);
  sc.stop_or_close = NOOP;
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(1, sc.ncalls);

  start_timer(loop, SIGCHLD, &tc);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(1, sc.ncalls);

  sc.ncalls = 0;
  sc.stop_or_close = CLOSE; /* now close it when it's done */
  uv_signal_start_oneshot(&sc.handle, signal_cb_one_shot, SIGCHLD);
  start_timer(loop, SIGCHLD, &tc);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(1, sc.ncalls);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}